

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmSourceFile.cxx
# Opt level: O2

string * __thiscall
cmSourceFile::GetLanguage_abi_cxx11_(string *__return_storage_ptr__,cmSourceFile *this)

{
  char *pcVar1;
  allocator *paVar2;
  allocator local_12;
  allocator local_11;
  
  pcVar1 = GetProperty(this,&propLANGUAGE_abi_cxx11_);
  if (pcVar1 == (char *)0x0) {
    if ((this->Language)._M_string_length != 0) {
      std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)&this->Language);
      return __return_storage_ptr__;
    }
    pcVar1 = "";
    paVar2 = &local_12;
  }
  else {
    paVar2 = &local_11;
  }
  std::__cxx11::string::string((string *)__return_storage_ptr__,pcVar1,paVar2);
  return __return_storage_ptr__;
}

Assistant:

std::string cmSourceFile::GetLanguage() const
{
  // If the language was set explicitly by the user then use it.
  if (const char* lang = this->GetProperty(propLANGUAGE)) {
    return lang;
  }

  // If the language was determined from the source file extension use it.
  if (!this->Language.empty()) {
    return this->Language;
  }

  // The language is not known.
  return "";
}